

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c.cc
# Opt level: O1

int ProgramMain(int argc,char **argv)

{
  OptionParser *pOVar1;
  ulong *puVar2;
  long *plVar3;
  pointer pcVar4;
  Errors *errors_00;
  uint uVar5;
  long lVar6;
  pointer pcVar7;
  bool bVar8;
  Result RVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  char *pcVar11;
  ulong *unaff_RBX;
  uint uVar12;
  ulong unaff_RBP;
  char **ppcVar13;
  OptionParser *this;
  string *psVar14;
  uint uVar15;
  uint uVar16;
  OptionParser *unaff_R12;
  uint uVar17;
  uint uVar18;
  ulong unaff_R13;
  uint uVar19;
  OptionParser *unaff_R14;
  uint uVar20;
  ulong unaff_R15;
  size_type __dnew;
  Errors errors;
  OptionParser parser;
  
  psVar14 = (string *)(ulong)(uint)argc;
  while( true ) {
    *(ulong *)((long)register0x00000020 + -8) = unaff_RBP;
    *(ulong *)((long)register0x00000020 + -0x10) = unaff_R15;
    *(OptionParser **)((long)register0x00000020 + -0x18) = unaff_R14;
    *(ulong *)((long)register0x00000020 + -0x20) = unaff_R13;
    *(OptionParser **)((long)register0x00000020 + -0x28) = unaff_R12;
    *(ulong **)((long)register0x00000020 + -0x30) = unaff_RBX;
    *(undefined8 *)((long)register0x00000020 + -0x280) = 0x116d92;
    wabt::InitStdio();
    *(undefined8 *)((long)register0x00000020 + -0x280) = 0x116db0;
    wabt::OptionParser::OptionParser
              ((OptionParser *)((long)register0x00000020 + -0xc0),"wasm2c",
               "  Read a file in the WebAssembly binary format, and convert it to\n  a C source file and header.\n\nexamples:\n  # parse binary file test.wasm and write test.c and test.h\n  $ wasm2c test.wasm -o test.c\n\n  # parse test.wasm, write test.c and test.h, but ignore the debug names, if any\n  $ wasm2c test.wasm --no-debug-names -o test.c\n"
              );
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x268))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x260) = 0;
    *(code **)((long)register0x00000020 + -0x250) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:76:72)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -600) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:76:72)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x280) = 0x116df0;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xc0),'v',"verbose",
               "Use multiple times for more info",
               (NullCallback *)((long)register0x00000020 + -0x268));
    if (*(code **)((long)register0x00000020 + -600) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x116e08;
      (**(code **)((long)register0x00000020 + -600))
                ((undefined1 *)((long)register0x00000020 + -0x268),
                 (undefined1 *)((long)register0x00000020 + -0x268),3);
    }
    *(undefined8 *)
     &(((Callback *)((long)register0x00000020 + -0x268))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x260) = 0;
    *(code **)((long)register0x00000020 + -0x250) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:83:7)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -600) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:83:7)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x280) = 0x116e54;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xc0),'o',"output","FILENAME",
               "Output file for the generated C source file, by default use stdout",
               (Callback *)((long)register0x00000020 + -0x268));
    if (*(code **)((long)register0x00000020 + -600) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x116e6c;
      (**(code **)((long)register0x00000020 + -600))
                ((undefined1 *)((long)register0x00000020 + -0x268),
                 (undefined1 *)((long)register0x00000020 + -0x268),3);
    }
    *(undefined8 *)
     &(((Callback *)((long)register0x00000020 + -0x268))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x260) = 0;
    *(code **)((long)register0x00000020 + -0x250) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:89:7)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -600) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:89:7)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x280) = 0x116eb5;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xc0),'\0',"num-outputs","NUM",
               "Number of output files to write",(Callback *)((long)register0x00000020 + -0x268));
    if (*(code **)((long)register0x00000020 + -600) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x116ecd;
      (**(code **)((long)register0x00000020 + -600))
                ((undefined1 *)((long)register0x00000020 + -0x268),
                 (undefined1 *)((long)register0x00000020 + -0x268),3);
    }
    *(undefined8 *)
     &(((Callback *)((long)register0x00000020 + -0x268))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x260) = 0;
    *(code **)((long)register0x00000020 + -0x250) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:96:7)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -600) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:96:7)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x280) = 0x116f19;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xc0),'n',"module-name","MODNAME",
               "Unique name for the module being generated. This name is prefixed to\neach of the generaed C symbols. By default, the module name from the\nnames section is used. If that is not present the name of the input\nfile is used as the default.\n"
               ,(Callback *)((long)register0x00000020 + -0x268));
    if (*(code **)((long)register0x00000020 + -600) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x116f31;
      (**(code **)((long)register0x00000020 + -600))
                ((undefined1 *)((long)register0x00000020 + -0x268),
                 (undefined1 *)((long)register0x00000020 + -0x268),3);
    }
    *(undefined8 *)((long)register0x00000020 + -0x280) = 0x116f48;
    wabt::Features::AddOptions
              (&s_write_c_options.features,(OptionParser *)((long)register0x00000020 + -0xc0));
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x268))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x260) = 0;
    *(code **)((long)register0x00000020 + -0x250) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:99:20)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -600) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:99:20)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x280) = 0x116f83;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xc0),"no-debug-names",
               "Ignore debug names in the binary file",
               (NullCallback *)((long)register0x00000020 + -0x268));
    if (*(code **)((long)register0x00000020 + -600) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x116f9b;
      (**(code **)((long)register0x00000020 + -600))
                ((undefined1 *)((long)register0x00000020 + -0x268),
                 (undefined1 *)((long)register0x00000020 + -0x268),3);
    }
    pOVar1 = (OptionParser *)((long)register0x00000020 + -600);
    *(OptionParser **)((long)register0x00000020 + -0x268) = pOVar1;
    (pOVar1->program_name_)._M_dataplus._M_p = (pointer)0x656d616e656c6966;
    *(undefined8 *)((long)register0x00000020 + -0x260) = 8;
    *(undefined1 *)((long)register0x00000020 + -0x250) = 0;
    *(undefined8 *)
     &(((Callback *)((long)register0x00000020 + -0x238))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x230) = 0;
    *(code **)((long)register0x00000020 + -0x220) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:101:22)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x228) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:101:22)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x280) = 0x116ff7;
    wabt::OptionParser::AddArgument
              ((OptionParser *)((long)register0x00000020 + -0xc0),
               (string *)((long)register0x00000020 + -0x268),One,
               (Callback *)((long)register0x00000020 + -0x238));
    if (*(code **)((long)register0x00000020 + -0x228) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x11700f;
      (**(code **)((long)register0x00000020 + -0x228))
                ((undefined1 *)((long)register0x00000020 + -0x238),
                 (undefined1 *)((long)register0x00000020 + -0x238),3);
    }
    if (*(OptionParser **)((long)register0x00000020 + -0x268) != pOVar1) {
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x117026;
      operator_delete(*(OptionParser **)((long)register0x00000020 + -0x268),
                      *(long *)((long)register0x00000020 + -600) + 1);
    }
    this = (OptionParser *)((long)register0x00000020 + -0xc0);
    ppcVar13 = (char **)((ulong)psVar14 & 0xffffffff);
    *(undefined8 *)((long)register0x00000020 + -0x280) = 0x117038;
    wabt::OptionParser::Parse(this,(int)psVar14,argv);
    bVar8 = s_write_c_options.features.exceptions_enabled_;
    uVar12 = 0;
    argv = ppcVar13;
    psVar14 = &this->program_name_;
    if (s_write_c_options.features.exceptions_enabled_ == true) {
      *(OptionParser **)((long)register0x00000020 + -0x268) = pOVar1;
      *(undefined8 *)((long)register0x00000020 + -600) = 0x6f69747065637865;
      *(undefined2 *)((long)register0x00000020 + -0x250) = 0x736e;
      *(undefined8 *)((long)register0x00000020 + -0x260) = 10;
      *(undefined1 *)((long)register0x00000020 + -0x24e) = 0;
      psVar14 = supported_features_abi_cxx11_;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x117086;
      pbVar10 = std::
                __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ();
      uVar12 = (uint)(pbVar10 ==
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &s_read_debug_names);
    }
    if ((bVar8 != false) &&
       (psVar14 = *(string **)((long)register0x00000020 + -0x268), (OptionParser *)psVar14 != pOVar1
       )) {
      argv = (char **)(*(long *)((long)register0x00000020 + -600) + 1);
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x1170ac;
      operator_delete(psVar14,(ulong)argv);
    }
    bVar8 = s_write_c_options.features.threads_enabled_;
    *(uint *)((long)register0x00000020 + -0x23c) = uVar12;
    uVar12 = 0;
    if (s_write_c_options.features.threads_enabled_ == true) {
      *(OptionParser **)((long)register0x00000020 + -0x238) =
           (OptionParser *)((long)register0x00000020 + -0x228);
      *(undefined4 *)((long)register0x00000020 + -0x228) = 0x65726874;
      *(undefined4 *)((long)register0x00000020 + -0x225) = 0x73646165;
      *(undefined8 *)((long)register0x00000020 + -0x230) = 7;
      *(undefined1 *)((long)register0x00000020 + -0x221) = 0;
      psVar14 = supported_features_abi_cxx11_;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x1170fd;
      pbVar10 = std::
                __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ();
      uVar12 = (uint)(pbVar10 ==
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &s_read_debug_names);
    }
    if ((bVar8 != false) &&
       (psVar14 = *(string **)((long)register0x00000020 + -0x238),
       (OptionParser *)psVar14 != (OptionParser *)((long)register0x00000020 + -0x228))) {
      argv = (char **)(*(long *)((long)register0x00000020 + -0x228) + 1);
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x117122;
      operator_delete(psVar14,(ulong)argv);
    }
    bVar8 = s_write_c_options.features.function_references_enabled_;
    *(undefined4 *)((long)register0x00000020 + -0x26c) = 0;
    if (s_write_c_options.features.function_references_enabled_ == true) {
      puVar2 = (ulong *)((long)register0x00000020 + -0xe0);
      *puVar2 = (ulong)((long)register0x00000020 + -0xd0);
      plVar3 = (long *)((long)register0x00000020 + -0x1b8);
      *plVar3 = 0x13;
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x117166;
      pcVar11 = (char *)std::__cxx11::string::_M_create(puVar2,(ulong)plVar3);
      *puVar2 = (ulong)pcVar11;
      lVar6 = *plVar3;
      *(long *)((long)register0x00000020 + -0xd0) = lVar6;
      builtin_strncpy(pcVar11,"function-references",0x13);
      *(long *)((long)register0x00000020 + -0xd8) = lVar6;
      *(undefined1 *)(*puVar2 + lVar6) = 0;
      psVar14 = supported_features_abi_cxx11_;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x1171a5;
      pbVar10 = std::
                __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (supported_features_abi_cxx11_,&s_read_debug_names,puVar2);
      *(uint *)((long)register0x00000020 + -0x26c) =
           (uint)(pbVar10 ==
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &s_read_debug_names);
    }
    if ((bVar8 != false) &&
       (psVar14 = *(string **)((long)register0x00000020 + -0xe0),
       (OptionParser *)psVar14 != (OptionParser *)((long)register0x00000020 + -0xd0))) {
      argv = (char **)(*(long *)((long)register0x00000020 + -0xd0) + 1);
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x1171d3;
      operator_delete(psVar14,(ulong)argv);
    }
    bVar8 = s_write_c_options.features.tail_call_enabled_;
    uVar15 = 0;
    if (s_write_c_options.features.tail_call_enabled_ == true) {
      *(OptionParser **)((long)register0x00000020 + -0x1b8) =
           (OptionParser *)((long)register0x00000020 + -0x1a8);
      *(undefined8 *)((long)register0x00000020 + -0x1a8) = 0x6c61632d6c696174;
      *(undefined2 *)((long)register0x00000020 + -0x1a0) = 0x6c;
      *(undefined8 *)((long)register0x00000020 + -0x1b0) = 9;
      psVar14 = supported_features_abi_cxx11_;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x117228;
      pbVar10 = std::
                __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ();
      uVar15 = (uint)(pbVar10 ==
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &s_read_debug_names);
    }
    if ((bVar8 != false) &&
       (psVar14 = *(string **)((long)register0x00000020 + -0x1b8),
       (OptionParser *)psVar14 != (OptionParser *)((long)register0x00000020 + -0x1a8))) {
      argv = (char **)(*(long *)((long)register0x00000020 + -0x1a8) + 1);
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x117254;
      operator_delete(psVar14,(ulong)argv);
    }
    bVar8 = s_write_c_options.features.annotations_enabled_;
    uVar17 = 0;
    if (s_write_c_options.features.annotations_enabled_ == true) {
      *(OptionParser **)((long)register0x00000020 + -0x100) =
           (OptionParser *)((long)register0x00000020 + -0xf0);
      *(undefined8 *)((long)register0x00000020 + -0xf0) = 0x697461746f6e6e61;
      *(undefined4 *)((long)register0x00000020 + -0xe9) = 0x736e6f69;
      *(undefined8 *)((long)register0x00000020 + -0xf8) = 0xb;
      *(undefined1 *)((long)register0x00000020 + -0xe5) = 0;
      psVar14 = supported_features_abi_cxx11_;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x1172ae;
      pbVar10 = std::
                __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ();
      uVar17 = (uint)(pbVar10 ==
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &s_read_debug_names);
    }
    if ((bVar8 != false) &&
       (psVar14 = *(string **)((long)register0x00000020 + -0x100),
       (OptionParser *)psVar14 != (OptionParser *)((long)register0x00000020 + -0xf0))) {
      argv = (char **)(*(long *)((long)register0x00000020 + -0xf0) + 1);
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x1172da;
      operator_delete(psVar14,(ulong)argv);
    }
    bVar8 = s_write_c_options.features.code_metadata_enabled_;
    *(undefined4 *)((long)register0x00000020 + -0x270) = 0;
    if (s_write_c_options.features.code_metadata_enabled_ == true) {
      *(OptionParser **)((long)register0x00000020 + -0x120) =
           (OptionParser *)((long)register0x00000020 + -0x110);
      *(undefined8 *)((long)register0x00000020 + -0x110) = 0x74656d2d65646f63;
      *(undefined8 *)((long)register0x00000020 + -0x10b) = 0x617461646174656d;
      *(undefined8 *)((long)register0x00000020 + -0x118) = 0xd;
      *(undefined1 *)((long)register0x00000020 + -0x103) = 0;
      psVar14 = supported_features_abi_cxx11_;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x117340;
      pbVar10 = std::
                __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ();
      *(uint *)((long)register0x00000020 + -0x270) =
           (uint)(pbVar10 ==
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &s_read_debug_names);
    }
    if ((bVar8 != false) &&
       (psVar14 = *(string **)((long)register0x00000020 + -0x120),
       (OptionParser *)psVar14 != (OptionParser *)((long)register0x00000020 + -0x110))) {
      argv = (char **)(*(long *)((long)register0x00000020 + -0x110) + 1);
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x11736e;
      operator_delete(psVar14,(ulong)argv);
    }
    bVar8 = s_write_c_options.features.gc_enabled_;
    *(uint *)((long)register0x00000020 + -0x240) = uVar17;
    uVar17 = 0;
    if (s_write_c_options.features.gc_enabled_ == true) {
      *(OptionParser **)((long)register0x00000020 + -0x140) =
           (OptionParser *)((long)register0x00000020 + -0x130);
      *(undefined2 *)((long)register0x00000020 + -0x130) = 0x6367;
      *(undefined8 *)((long)register0x00000020 + -0x138) = 2;
      *(undefined1 *)((long)register0x00000020 + -0x12e) = 0;
      psVar14 = supported_features_abi_cxx11_;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x1173c1;
      pbVar10 = std::
                __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ();
      uVar17 = (uint)(pbVar10 ==
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &s_read_debug_names);
    }
    uVar16 = *(uint *)((long)register0x00000020 + -0x23c);
    if ((bVar8 != false) &&
       (psVar14 = *(string **)((long)register0x00000020 + -0x140),
       (OptionParser *)psVar14 != (OptionParser *)((long)register0x00000020 + -0x130))) {
      argv = (char **)(*(long *)((long)register0x00000020 + -0x130) + 1);
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x1173f1;
      operator_delete(psVar14,(ulong)argv);
    }
    bVar8 = s_write_c_options.features.memory64_enabled_;
    uVar20 = *(uint *)((long)register0x00000020 + -0x26c);
    uVar19 = 0;
    if (s_write_c_options.features.memory64_enabled_ == true) {
      *(undefined1 **)((long)register0x00000020 + -0x1d8) =
           (undefined1 *)((long)register0x00000020 + -0x1c8);
      *(undefined8 *)((long)register0x00000020 + -0x1c8) = 0x343679726f6d656d;
      *(undefined8 *)((long)register0x00000020 + -0x1d0) = 8;
      *(undefined1 *)((long)register0x00000020 + -0x1c0) = 0;
      psVar14 = supported_features_abi_cxx11_;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x117448;
      pbVar10 = std::
                __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ();
      uVar19 = (uint)(pbVar10 ==
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &s_read_debug_names);
    }
    uVar5 = *(uint *)((long)register0x00000020 + -0x240);
    unaff_RBX = (ulong *)(ulong)uVar5;
    if ((bVar8 != false) &&
       (psVar14 = *(string **)((long)register0x00000020 + -0x1d8),
       (OptionParser *)psVar14 != (OptionParser *)((long)register0x00000020 + -0x1c8))) {
      argv = (char **)(*(long *)((long)register0x00000020 + -0x1c8) + 1);
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x117483;
      operator_delete(psVar14,(ulong)argv);
    }
    bVar8 = s_write_c_options.features.multi_memory_enabled_;
    uVar18 = 0;
    if (s_write_c_options.features.multi_memory_enabled_ == true) {
      *(undefined1 **)((long)register0x00000020 + -0x1f8) =
           (undefined1 *)((long)register0x00000020 + -0x1e8);
      *(undefined8 *)((long)register0x00000020 + -0x1e8) = 0x656d2d69746c756d;
      *(undefined4 *)((long)register0x00000020 + -0x1e0) = 0x79726f6d;
      *(undefined8 *)((long)register0x00000020 + -0x1f0) = 0xc;
      *(undefined1 *)((long)register0x00000020 + -0x1dc) = 0;
      psVar14 = supported_features_abi_cxx11_;
      unaff_RBX = (ulong *)&s_read_debug_names;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x1174df;
      pbVar10 = std::
                __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ();
      uVar18 = (uint)(pbVar10 ==
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &s_read_debug_names);
    }
    uVar12 = uVar12 | uVar16 | uVar20 | uVar15 | uVar5 |
             *(uint *)((long)register0x00000020 + -0x270);
    if ((bVar8 != false) &&
       (psVar14 = *(string **)((long)register0x00000020 + -0x1f8),
       (OptionParser *)psVar14 != (OptionParser *)((long)register0x00000020 + -0x1e8))) {
      argv = (char **)(*(long *)((long)register0x00000020 + -0x1e8) + 1);
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x117517;
      operator_delete(psVar14,(ulong)argv);
    }
    bVar8 = s_write_c_options.features.extended_const_enabled_;
    uVar15 = 0;
    if (s_write_c_options.features.extended_const_enabled_ == true) {
      *(undefined1 **)((long)register0x00000020 + -0x218) =
           (undefined1 *)((long)register0x00000020 + -0x208);
      *(undefined8 *)((long)register0x00000020 + -0x208) = 0x6465646e65747865;
      *(undefined8 *)((long)register0x00000020 + -0x202) = 0x74736e6f632d6465;
      *(undefined8 *)((long)register0x00000020 + -0x210) = 0xe;
      *(undefined1 *)((long)register0x00000020 + -0x1fa) = 0;
      psVar14 = supported_features_abi_cxx11_;
      unaff_RBX = (ulong *)&s_read_debug_names;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x117575;
      pbVar10 = std::
                __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ();
      uVar15 = (uint)(pbVar10 ==
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &s_read_debug_names);
    }
    if ((bVar8 != false) &&
       (psVar14 = *(string **)((long)register0x00000020 + -0x218),
       (OptionParser *)psVar14 != (OptionParser *)((long)register0x00000020 + -0x208))) {
      argv = (char **)(*(long *)((long)register0x00000020 + -0x208) + 1);
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x1175a3;
      operator_delete(psVar14,(ulong)argv);
    }
    bVar8 = s_write_c_options.features.relaxed_simd_enabled_;
    unaff_R13 = (ulong)s_write_c_options.features.relaxed_simd_enabled_;
    uVar16 = 0;
    unaff_R14 = (OptionParser *)((long)register0x00000020 + -0x150);
    if (s_write_c_options.features.relaxed_simd_enabled_ == true) {
      *(OptionParser **)((long)register0x00000020 + -0x160) = unaff_R14;
      *(undefined8 *)((long)register0x00000020 + -0x150) = 0x2d646578616c6572;
      *(undefined4 *)((long)register0x00000020 + -0x148) = 0x646d6973;
      *(undefined8 *)((long)register0x00000020 + -0x158) = 0xc;
      *(undefined1 *)((long)register0x00000020 + -0x144) = 0;
      psVar14 = supported_features_abi_cxx11_;
      unaff_RBX = (ulong *)&s_read_debug_names;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x117600;
      pbVar10 = std::
                __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ();
      uVar16 = (uint)(pbVar10 ==
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &s_read_debug_names);
    }
    if ((bVar8 != false) &&
       (psVar14 = *(string **)((long)register0x00000020 + -0x160),
       (OptionParser *)psVar14 != unaff_R14)) {
      argv = (char **)(*(long *)((long)register0x00000020 + -0x150) + 1);
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x11762f;
      operator_delete(psVar14,(ulong)argv);
    }
    bVar8 = s_write_c_options.features.custom_page_sizes_enabled_;
    unaff_RBP = (ulong)CONCAT31((int3)(uVar12 >> 8),
                                s_write_c_options.features.custom_page_sizes_enabled_);
    uVar20 = 0;
    unaff_R12 = (OptionParser *)((long)register0x00000020 + -0x170);
    if (s_write_c_options.features.custom_page_sizes_enabled_ == true) {
      unaff_RBX = (ulong *)((long)register0x00000020 + -0x180);
      *unaff_RBX = (ulong)unaff_R12;
      plVar3 = (long *)((long)register0x00000020 + -0x198);
      *plVar3 = 0x11;
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x117670;
      pcVar11 = (char *)std::__cxx11::string::_M_create(unaff_RBX,(ulong)plVar3);
      *unaff_RBX = (ulong)pcVar11;
      lVar6 = *plVar3;
      *(long *)((long)register0x00000020 + -0x170) = lVar6;
      builtin_strncpy(pcVar11,"custom-page-sizes",0x11);
      *(long *)((long)register0x00000020 + -0x178) = lVar6;
      *(undefined1 *)(*unaff_RBX + lVar6) = 0;
      psVar14 = supported_features_abi_cxx11_;
      unaff_R14 = (OptionParser *)&s_read_debug_names;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x1176ac;
      pbVar10 = std::
                __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (supported_features_abi_cxx11_,&s_read_debug_names,unaff_RBX);
      uVar20 = (uint)(pbVar10 ==
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &s_read_debug_names);
    }
    uVar20 = uVar15 | uVar12 | uVar17 | uVar19 | uVar18 | uVar16 | uVar20;
    unaff_R15 = (ulong)uVar20;
    if ((bVar8 != false) &&
       (psVar14 = *(string **)((long)register0x00000020 + -0x180),
       (OptionParser *)psVar14 != unaff_R12)) {
      argv = (char **)(*(long *)((long)register0x00000020 + -0x170) + 1);
      *(undefined8 *)((long)register0x00000020 + -0x280) = 0x1176d9;
      operator_delete(psVar14,(ulong)argv);
    }
    if (uVar20 == 0) break;
    *(code **)((long)register0x00000020 + -0x280) = main;
    ProgramMain();
    register0x00000020 = (BADSPACEBASE *)((long)register0x00000020 + -0x278);
  }
  if (*(code **)((long)register0x00000020 + -0x40) != (code *)0x0) {
    *(undefined8 *)((long)register0x00000020 + -0x280) = 0x117701;
    (**(code **)((long)register0x00000020 + -0x40))
              ((undefined1 *)((long)register0x00000020 + -0x50),
               (undefined1 *)((long)register0x00000020 + -0x50),3);
  }
  *(undefined8 *)((long)register0x00000020 + -0x280) = 0x11770e;
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            ((vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> *)
             ((long)register0x00000020 + -0x68));
  *(undefined8 *)((long)register0x00000020 + -0x280) = 0x11771e;
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
             ((long)register0x00000020 + -0x80));
  if (*(undefined1 **)((long)register0x00000020 + -0xa0) !=
      (undefined1 *)((long)register0x00000020 + -0x90)) {
    *(undefined8 *)((long)register0x00000020 + -0x280) = 0x11773f;
    operator_delete(*(undefined1 **)((long)register0x00000020 + -0xa0),
                    *(long *)((long)register0x00000020 + -0x90) + 1);
  }
  pcVar4 = (pointer)((long)register0x00000020 + -0xb0);
  if (*(pointer *)((long)register0x00000020 + -0xc0) != pcVar4) {
    *(undefined8 *)((long)register0x00000020 + -0x280) = 0x117761;
    operator_delete(*(pointer *)((long)register0x00000020 + -0xc0),
                    *(long *)((long)register0x00000020 + -0xb0) + 1);
  }
  errors_00 = (Errors *)((long)register0x00000020 + -0x198);
  *(undefined8 *)((long)register0x00000020 + -0x188) = 0;
  (errors_00->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)register0x00000020 + -400) = 0;
  *(undefined8 *)((long)register0x00000020 + -0x280) = 0x11777f;
  RVar9 = Wasm2cMain(errors_00);
  psVar14 = (string *)((long)register0x00000020 + -0xc0);
  (psVar14->_M_dataplus)._M_p = pcVar4;
  *(undefined8 *)((long)register0x00000020 + -0xb8) = 0;
  *(undefined1 *)((long)register0x00000020 + -0xb0) = 0;
  *(undefined4 *)((long)register0x00000020 + -0x278) = 0x50;
  *(undefined8 *)((long)register0x00000020 + -0x280) = 0x1177bb;
  wabt::FormatErrorsToFile
            (errors_00,Binary,(LexerSourceLineFinder *)0x0,_stderr,psVar14,Never,
             *(int *)((long)register0x00000020 + -0x278));
  pcVar7 = (psVar14->_M_dataplus)._M_p;
  if (pcVar7 != pcVar4) {
    *(undefined8 *)((long)register0x00000020 + -0x280) = 0x1177d3;
    operator_delete(pcVar7,*(long *)((long)register0x00000020 + -0xb0) + 1);
  }
  *(undefined8 *)((long)register0x00000020 + -0x280) = 0x1177e8;
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
             ((long)register0x00000020 + -0x198));
  return (int)(RVar9.enum_ != Ok);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  Errors errors;
  result = Wasm2cMain(errors);
  FormatErrorsToFile(errors, Location::Type::Binary);

  return result != Result::Ok;
}